

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case0917(DeclarationBinderTester *this)

{
  socklen_t in_ECX;
  Expectation local_110;
  allocator<char> local_41;
  string local_40 [32];
  code *local_20;
  offset_in_ParserTester_to_subr x;
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_20 = ParserTester::case0052;
  x = 0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"int int x ;",&local_41);
  Expectation::Expectation(&local_110);
  bind(this,(int)local_40,(sockaddr *)&local_110,in_ECX);
  Expectation::~Expectation(&local_110);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

void DeclarationBinderTester::case0917()
{
    CROSS_REFERENCE_TEST(ParserTester::case0052);

    bind("int int x ;");
}